

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall S2Loop::DecodeInternal(S2Loop *this,Decoder *decoder,bool within_scope)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  uchar *__src;
  undefined1 auVar4 [16];
  bool bVar5;
  S2Point *pSVar6;
  uint *puVar7;
  size_t __n;
  ulong uVar8;
  ulong uVar9;
  S2LatLngRect SStack_58;
  
  puVar7 = (uint *)decoder->buf_;
  puVar3 = (uint *)decoder->limit_;
  if (puVar3 < puVar7) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&SStack_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
               ,0x1a1,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)SStack_58.lat_.bounds_.c_[0],"Check failed: (limit_) >= (buf_) ",0x21);
LAB_001fc2d8:
    abort();
  }
  if (3 < (ulong)((long)puVar3 - (long)puVar7)) {
    uVar1 = *puVar7;
    puVar7 = puVar7 + 1;
    decoder->buf_ = (uchar *)puVar7;
    if (uVar1 <= (uint)FLAGS_s2polygon_decode_max_num_vertices) {
      if (puVar3 < puVar7) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&SStack_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
                   ,0x1a1,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)SStack_58.lat_.bounds_.c_[0],"Check failed: (limit_) >= (buf_) ",0x21)
        ;
        goto LAB_001fc2d8;
      }
      if ((ulong)uVar1 * 0x18 + 5 <= (ulong)((long)puVar3 - (long)puVar7)) {
        (this->unindexed_contains_calls_).super___atomic_base<int>._M_i = 0;
        MutableS2ShapeIndex::Clear(&this->index_);
        if ((this->owns_vertices_ == true) && (this->vertices_ != (S2Point *)0x0)) {
          operator_delete__(this->vertices_);
        }
        this->num_vertices_ = uVar1;
        if (within_scope) {
          pSVar6 = (S2Point *)decoder->buf_;
          this->vertices_ = pSVar6;
          pSVar6 = pSVar6 + (int)uVar1;
          bVar5 = false;
        }
        else {
          uVar9 = (ulong)(int)uVar1;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar9;
          uVar8 = 0xffffffffffffffff;
          if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
            uVar8 = SUB168(auVar4 * ZEXT816(0x18),0);
          }
          pSVar6 = (S2Point *)operator_new__(uVar8);
          if (uVar1 == 0) {
            __n = 0;
          }
          else {
            __n = uVar9 * 0x18;
            memset(pSVar6,0,((uVar9 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
          }
          this->vertices_ = pSVar6;
          __src = decoder->buf_;
          memcpy(pSVar6,__src,__n);
          pSVar6 = (S2Point *)(__src + __n);
          bVar5 = true;
        }
        decoder->buf_ = (uchar *)pSVar6;
        this->owns_vertices_ = bVar5;
        this->origin_inside_ = *(uchar *)pSVar6->c_ != '\0';
        iVar2 = *(int *)((long)pSVar6->c_ + 1);
        decoder->buf_ = (uchar *)((long)pSVar6->c_ + 5);
        this->depth_ = iVar2;
        bVar5 = S2LatLngRect::Decode(&this->bound_,decoder);
        if (bVar5) {
          S2LatLngRectBounder::ExpandForSubregions(&SStack_58,&this->bound_);
          (this->subregion_bound_).lng_.bounds_.c_[0] = SStack_58.lng_.bounds_.c_[0];
          (this->subregion_bound_).lng_.bounds_.c_[1] = SStack_58.lng_.bounds_.c_[1];
          (this->subregion_bound_).lat_.bounds_.c_[0] = SStack_58.lat_.bounds_.c_[0];
          (this->subregion_bound_).lat_.bounds_.c_[1] = SStack_58.lat_.bounds_.c_[1];
          if (uVar1 == 0) {
            return true;
          }
          InitIndex(this);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool S2Loop::DecodeInternal(Decoder* const decoder,
                            bool within_scope) {
  // Perform all checks before modifying vertex state. Empty loops are
  // explicitly allowed here: a newly created loop has zero vertices
  // and such loops encode and decode properly.
  if (decoder->avail() < sizeof(uint32)) return false;
  const uint32 num_vertices = decoder->get32();
  if (num_vertices > FLAGS_s2polygon_decode_max_num_vertices) {
    return false;
  }
  if (decoder->avail() < (num_vertices * sizeof(*vertices_) +
                          sizeof(uint8) + sizeof(uint32))) {
    return false;
  }
  ClearIndex();
  if (owns_vertices_) delete[] vertices_;
  num_vertices_ = num_vertices;

  // x86 can do unaligned floating-point reads; however, many other
  // platforms cannot. Do not use the zero-copy version if we are on
  // an architecture that does not support unaligned reads, and the
  // pointer is not correctly aligned.
#if defined(__x86_64__) || defined(_M_X64) || defined(__i386) || \
    defined(_M_IX86)
  bool is_misaligned = false;
#else
  bool is_misaligned =
      reinterpret_cast<intptr_t>(decoder->ptr()) % sizeof(double) != 0;
#endif
  if (within_scope && !is_misaligned) {
    vertices_ = const_cast<S2Point *>(reinterpret_cast<const S2Point*>(
                    decoder->ptr()));
    decoder->skip(num_vertices_ * sizeof(*vertices_));
    owns_vertices_ = false;
  } else {
    vertices_ = new S2Point[num_vertices_];
    decoder->getn(vertices_, num_vertices_ * sizeof(*vertices_));
    owns_vertices_ = true;
  }
  origin_inside_ = decoder->get8();
  depth_ = decoder->get32();
  if (!bound_.Decode(decoder)) return false;
  subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);

  // An initialized loop will have some non-zero count of vertices. A default
  // (uninitialized) has zero vertices. This code supports encoding and
  // decoding of uninitialized loops, but we only want to call InitIndex for
  // initialized loops. Otherwise we defer InitIndex until the call to Init().
  if (num_vertices > 0) {
    InitIndex();
  }

  return true;
}